

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O3

void __thiscall
shaping_clipper::feed
          (shaping_clipper *this,float *in_samples,float *out_samples,bool diff_only,
          float *total_margin_shift)

{
  int iVar1;
  pointer pfVar2;
  PFFFT_Setup *pPVar3;
  int i;
  ulong uVar4;
  float *pfVar5;
  float *pfVar6;
  undefined7 in_register_00000009;
  pointer pfVar7;
  int iVar8;
  long lVar9;
  float *mask_curve;
  ulong uVar10;
  shaping_clipper *psVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  float *clipping_delta;
  float *pfVar17;
  float fVar18;
  float delta_boost;
  float fVar19;
  float fVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  float afStack_c0 [2];
  undefined1 local_b8 [24];
  float *local_a0;
  undefined1 local_98 [16];
  float *local_88;
  float *local_80;
  float local_74;
  float local_70;
  undefined4 local_6c;
  float diff_needed;
  float *local_60;
  PFFFT_Setup *local_58;
  float *local_50;
  ulong local_48;
  uint local_3c;
  shaping_clipper *local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,diff_only);
  iVar1 = this->size;
  iVar8 = this->overlap;
  lVar9 = (long)iVar8;
  if (0 < iVar1 - iVar8) {
    pfVar7 = (this->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (this->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    do {
      pfVar7[uVar16] = pfVar7[lVar9 + uVar16];
      pfVar2[uVar16] = pfVar2[lVar9 + uVar16];
      uVar16 = uVar16 + 1;
    } while ((uint)(iVar1 - iVar8) != uVar16);
  }
  pfVar7 = (this->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < iVar8) {
    pfVar2 = (this->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = 0;
    do {
      iVar15 = (iVar1 - iVar8) + (int)lVar14;
      pfVar7[iVar15] = in_samples[lVar14];
      pfVar2[iVar15] = 0.0;
      lVar14 = lVar14 + 1;
    } while (lVar9 != lVar14);
  }
  uVar16 = (long)this->oversample * (long)iVar1 * 4 + 0xfU & 0xfffffffffffffff0;
  pfVar6 = (float *)(local_b8 + -uVar16);
  clipping_delta = (float *)((long)pfVar6 - uVar16);
  pfVar17 = (float *)((long)clipping_delta - uVar16);
  mask_curve = (float *)((long)pfVar17 - ((long)(iVar1 / 2) * 4 + 0x13U & 0xfffffffffffffff0));
  local_a0 = out_samples;
  local_50 = total_margin_shift;
  local_38 = this;
  if (0 < iVar1) {
    iVar8 = this->max_oversample;
    pfVar5 = (this->window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      pfVar6[lVar9] = pfVar7[lVar9] * *pfVar5;
      lVar9 = lVar9 + 1;
      pfVar5 = pfVar5 + iVar8;
    } while (iVar1 != lVar9);
  }
  pPVar3 = this->pffft;
  mask_curve[-2] = 1.498385e-39;
  mask_curve[-1] = 0.0;
  pffft_transform_ordered(pPVar3,pfVar6,pfVar17,(float *)0x0,PFFFT_FORWARD);
  psVar11 = local_38;
  mask_curve[-2] = 1.498406e-39;
  mask_curve[-1] = 0.0;
  calculate_mask_curve(psVar11,pfVar17,mask_curve);
  uVar13 = local_38->size;
  uVar16 = (ulong)uVar13;
  iVar1 = local_38->oversample;
  uVar12 = iVar1 * uVar13;
  iVar8 = local_38->max_oversample / iVar1;
  uVar10 = (ulong)uVar12;
  _diff_needed = pfVar17;
  local_3c = uVar12;
  if (iVar1 < 2) {
    local_58 = local_38->pffft;
    pfVar17 = local_50;
    psVar11 = local_38;
  }
  else {
    local_48 = CONCAT44(local_48._4_4_,iVar8);
    local_58 = local_38->pffft_oversampled;
    pfVar17[(int)uVar13] = pfVar17[1] * 0.5;
    pfVar17[1] = 0.0;
    lVar9 = (long)(int)uVar13 + 1;
    if ((int)lVar9 < (int)uVar12) {
      mask_curve[-2] = 1.49858e-39;
      mask_curve[-1] = 0.0;
      memset(pfVar17 + lVar9,0,(ulong)(uVar13 * (iVar1 + -1) - 2) * 4 + 4);
    }
    pPVar3 = local_58;
    mask_curve[-2] = 1.498612e-39;
    mask_curve[-1] = 0.0;
    pffft_transform_ordered(pPVar3,pfVar17,pfVar6,(float *)0x0,PFFFT_BACKWARD);
    psVar11 = local_38;
    uVar12 = local_3c;
    uVar13 = local_38->size;
    uVar16 = (ulong)uVar13;
    if (0 < (int)local_3c) {
      uVar4 = 0;
      do {
        pfVar6[uVar4] = pfVar6[uVar4] / (float)(int)uVar13;
        uVar4 = uVar4 + 1;
      } while (uVar10 != uVar4);
    }
    pfVar17 = local_50;
    iVar8 = (int)local_48;
    if (-2 < (int)uVar13) {
      iVar1 = psVar11->oversample;
      uVar4 = 0;
      do {
        mask_curve[uVar4] = mask_curve[uVar4] * (float)iVar1;
        uVar4 = uVar4 + 1;
      } while ((int)uVar13 / 2 + 1 != uVar4);
    }
  }
  if ((int)uVar12 < 1) {
    local_60 = &psVar11->clip_level;
    uVar21 = 0;
    uVar22 = 0;
    uVar23 = 0;
    fVar20 = 0.0 / psVar11->clip_level;
  }
  else {
    pfVar5 = (psVar11->inv_window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    fVar18 = 0.0;
    do {
      fVar20 = ABS(pfVar6[uVar4] * *pfVar5);
      if (ABS(pfVar6[uVar4] * *pfVar5) <= fVar18) {
        fVar20 = fVar18;
      }
      uVar4 = uVar4 + 1;
      pfVar5 = pfVar5 + iVar8;
      fVar18 = fVar20;
    } while (uVar10 != uVar4);
    local_60 = &psVar11->clip_level;
    fVar20 = fVar20 / psVar11->clip_level;
    uVar21 = 0;
    uVar22 = 0;
    uVar23 = 0;
    if (0 < (int)uVar12) {
      local_98 = ZEXT416((uint)fVar20);
      local_48 = uVar16;
      mask_curve[-2] = 1.498947e-39;
      mask_curve[-1] = 0.0;
      memset(clipping_delta,0,uVar10 * 4);
      pfVar17 = local_50;
      psVar11 = local_38;
      uVar16 = local_48;
      fVar20 = (float)local_98._0_4_;
      uVar21 = local_98._4_4_;
      uVar22 = local_98._8_4_;
      uVar23 = local_98._12_4_;
      uVar12 = local_3c;
    }
  }
  uVar13 = (uint)uVar16;
  if (pfVar17 != (float *)0x0) {
    *pfVar17 = 1.0;
  }
  fVar18 = psVar11->iterations;
  if (0.0 < fVar18) {
    local_74 = (float)(int)uVar12;
    local_80 = _diff_needed + 1;
    local_70 = fVar20 + -1.0;
    uVar16 = 0;
    fVar19 = 0.0;
    local_98._4_4_ = uVar21;
    local_98._0_4_ = fVar20;
    local_98._8_4_ = uVar22;
    local_98._12_4_ = uVar23;
    local_88 = pfVar6;
    do {
      delta_boost = 2.0;
      local_b8._0_16_ = ZEXT416((uint)fVar19);
      if (fVar19 < fVar18 / -3.0 + fVar18 || 2.0 <= fVar20) {
        delta_boost = 1.0;
      }
      local_48 = uVar16;
      mask_curve[-2] = 1.499244e-39;
      mask_curve[-1] = 0.0;
      clip_to_window(psVar11,pfVar6,clipping_delta,delta_boost);
      pPVar3 = local_58;
      pfVar6 = _diff_needed;
      mask_curve[-2] = 1.499273e-39;
      mask_curve[-1] = 0.0;
      pffft_transform_ordered(pPVar3,clipping_delta,pfVar6,(float *)0x0,PFFFT_FORWARD);
      psVar11 = local_38;
      iVar1 = local_38->oversample;
      if (1 < iVar1) {
        *local_80 = 0.0;
        iVar15 = psVar11->size;
        if (iVar15 + 1 < iVar15 * iVar1) {
          pfVar6 = local_80 + iVar15;
          mask_curve[-2] = 1.499368e-39;
          mask_curve[-1] = 0.0;
          memset(pfVar6,0,(ulong)((iVar1 + -1) * iVar15 - 2) * 4 + 4);
          psVar11 = local_38;
        }
      }
      pfVar6 = _diff_needed;
      mask_curve[-2] = 1.499395e-39;
      mask_curve[-1] = 0.0;
      limit_clip_spectrum(psVar11,pfVar6,mask_curve);
      pPVar3 = local_58;
      mask_curve[-2] = 1.499427e-39;
      mask_curve[-1] = 0.0;
      pffft_transform_ordered(pPVar3,pfVar6,clipping_delta,(float *)0x0,PFFFT_BACKWARD);
      uVar13 = local_3c;
      uVar16 = local_48;
      pfVar17 = local_50;
      fVar18 = local_74;
      fVar20 = 0.0;
      uVar21 = local_98._0_4_;
      if (0 < (int)local_3c) {
        uVar4 = 0;
        do {
          clipping_delta[uVar4] = clipping_delta[uVar4] / fVar18;
          uVar4 = uVar4 + 1;
        } while (uVar10 != uVar4);
        fVar20 = 0.0;
        if (0 < (int)uVar13) {
          pfVar6 = (local_38->inv_window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar20 = 0.0;
          uVar4 = 0;
          do {
            fVar18 = ABS((local_88[uVar4] + clipping_delta[uVar4]) * *pfVar6);
            if (fVar18 <= fVar20) {
              fVar18 = fVar20;
            }
            fVar20 = fVar18;
            uVar4 = uVar4 + 1;
            pfVar6 = pfVar6 + iVar8;
          } while (uVar10 != uVar4);
        }
      }
      psVar11 = local_38;
      pfVar6 = local_88;
      fVar20 = fVar20 / *local_60;
      fVar18 = 1.122;
      if ((1.0 < (float)uVar21) && (fVar18 = 1.122, 1.0 < fVar20)) {
        fVar19 = (float)uVar21 - fVar20;
        fVar18 = fVar20;
        if ((0.0 < fVar19) &&
           (((float)((int)uVar16 + 1) < local_38->iterations + local_38->iterations / -3.0 &&
            (fVar19 = local_70 / fVar19, fVar19 <= fVar20)))) {
          fVar18 = fVar19;
        }
        if (fVar18 <= 1.122) {
          fVar18 = 1.122;
        }
      }
      fVar18 = local_38->adaptive_distortion_strength * (fVar18 + -1.0) + 1.0;
      if (((pfVar17 != (float *)0x0) && (1.01 < fVar20)) &&
         ((float)local_b8._0_4_ < local_38->iterations + -1.0)) {
        *pfVar17 = *pfVar17 * fVar18;
      }
      uVar13 = local_38->size;
      if (-2 < (int)uVar13) {
        uVar4 = 0;
        do {
          mask_curve[uVar4] = mask_curve[uVar4] * fVar18;
          uVar4 = uVar4 + 1;
        } while ((int)uVar13 / 2 + 1 != uVar4);
      }
      uVar12 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar12;
      fVar19 = (float)(int)uVar12;
      fVar18 = psVar11->iterations;
    } while (fVar19 < fVar18);
  }
  pfVar6 = local_a0;
  iVar1 = psVar11->oversample;
  if (1 < (long)iVar1) {
    if ((int)uVar13 < 1) {
      uVar13 = psVar11->overlap;
      if ((int)uVar13 < 1) {
        return;
      }
      pfVar7 = (psVar11->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_00105618;
    }
    uVar16 = 0;
    pfVar17 = clipping_delta;
    do {
      clipping_delta[uVar16] = *pfVar17;
      uVar16 = uVar16 + 1;
      pfVar17 = pfVar17 + iVar1;
    } while (uVar13 != uVar16);
  }
  pfVar7 = (psVar11->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)uVar13) {
    iVar8 = psVar11->max_oversample;
    pfVar17 = (psVar11->window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar16 = 0;
    do {
      pfVar7[uVar16] = clipping_delta[uVar16] * *pfVar17 + pfVar7[uVar16];
      uVar16 = uVar16 + 1;
      pfVar17 = pfVar17 + iVar8;
    } while (uVar13 != uVar16);
  }
  uVar13 = psVar11->overlap;
  if ((int)uVar13 < 1) {
    return;
  }
LAB_00105618:
  uVar10 = (ulong)uVar13;
  uVar16 = 0;
  do {
    pfVar6[uVar16] = pfVar7[uVar16] / 1.5;
    uVar16 = uVar16 + 1;
  } while (uVar10 != uVar16);
  if (1 < iVar1) {
    fVar20 = 0.0;
    uVar16 = 0;
    do {
      fVar18 = ABS(pfVar6[uVar16]);
      if (ABS(pfVar6[uVar16]) <= fVar20) {
        fVar18 = fVar20;
      }
      fVar20 = fVar18;
      uVar16 = uVar16 + 1;
    } while (uVar10 != uVar16);
    if (fVar20 < *local_60 * 0.001) {
      mask_curve[-2] = 1.500425e-39;
      mask_curve[-1] = 0.0;
      memset(pfVar6,0,uVar10 * 4);
      psVar11 = local_38;
    }
  }
  if ((char)local_6c == '\0') {
    pfVar7 = (psVar11->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    do {
      pfVar6[uVar16] = pfVar7[uVar16] + pfVar6[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar10 != uVar16);
  }
  return;
}

Assistant:

void shaping_clipper::feed(const float* in_samples, float* out_samples, bool diff_only, float* total_margin_shift) {
    // shift in/out buffers
    for (int i = 0; i < this->size - this->overlap; i++) {
        this->in_frame[i] = this->in_frame[i + this->overlap];
        this->out_dist_frame[i] = this->out_dist_frame[i + this->overlap];
    }
    for (int i = 0; i < this->overlap; i++) {
        this->in_frame[i + this->size - this->overlap] = in_samples[i];
        this->out_dist_frame[i + this->size - this->overlap] = 0;
    }

    float peak;
    float* windowed_frame = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* clipping_delta = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* spectrum_buf = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* mask_curve = (float*)alloca(sizeof(float) * (this->size / 2 + 1));

    apply_window(this->in_frame.data(), windowed_frame);
    pffft_transform_ordered(this->pffft, windowed_frame, spectrum_buf, NULL, PFFFT_FORWARD);
    calculate_mask_curve(spectrum_buf, mask_curve);

    int clipping_samples = this->size * this->oversample;
    int window_stride = this->max_oversample / this->oversample;
    PFFFT_Setup* clipping_pffft = this->pffft;
    if (this->oversample > 1) {
        clipping_pffft = this->pffft_oversampled;

        // use IFFT to oversample the windowed frame
        spectrum_buf[this->size] = spectrum_buf[1] / 2;
        spectrum_buf[1] = 0;
        for (int i = this->size + 1; i < this->size * this->oversample; i++) {
            spectrum_buf[i] = 0;
        }
        pffft_transform_ordered(this->pffft_oversampled, spectrum_buf, windowed_frame, NULL, PFFFT_BACKWARD);
        float fft_ifft_scale = this->size;
        for (int i = 0; i < clipping_samples; i++) {
            windowed_frame[i] /= fft_ifft_scale;
        }

        for (int i = 0; i < this->size / 2 + 1; i++) {
            mask_curve[i] *= this->oversample;
        }
    }

    float orig_peak = 0;
    for (int sample_idx = 0, window_idx = 0; sample_idx < clipping_samples; sample_idx++, window_idx += window_stride) {
        orig_peak = std::max<float>(orig_peak, std::abs(windowed_frame[sample_idx] * inv_window[window_idx]));
    }
    orig_peak /= this->clip_level;
    peak = orig_peak;

    // clear clipping_delta
    for (int i = 0; i < clipping_samples; i++) {
        clipping_delta[i] = 0;
    }

    if (total_margin_shift) {
        *total_margin_shift = 1.0;
    }

    // repeat clipping-filtering process a few times to control both the peaks and the spectrum
    for (int i = 0; i < this->iterations; i++) {
        // The last 1/3 of rounds have boosted delta to help reach the peak target faster
        float delta_boost = 1.0;
        if (i >= this->iterations - this->iterations / 3) {
            // boosting the delta when largs peaks are still present is dangerous
            if (peak < 2.0) {
                delta_boost = 2.0;
            }
        }
        clip_to_window(windowed_frame, clipping_delta, delta_boost);

        pffft_transform_ordered(clipping_pffft, clipping_delta, spectrum_buf, NULL, PFFFT_FORWARD);

        if (this->oversample > 1) {
            // Zero out all frequency bins above the base nyquist rate.
            // limit_clip_spectrum doesn't handle these bins.
            spectrum_buf[1] = 0;
            for (int i = this->size + 1; i < this->size * this->oversample; i++) {
                spectrum_buf[i] = 0;
            }
        }

        limit_clip_spectrum(spectrum_buf, mask_curve);

        pffft_transform_ordered(clipping_pffft, spectrum_buf, clipping_delta, NULL, PFFFT_BACKWARD);
        // see pffft.h
        for (int i = 0; i < clipping_samples; i++) {
            clipping_delta[i] /= clipping_samples;
        }

        peak = 0;
        for (int sample_idx = 0, window_idx = 0; sample_idx < clipping_samples; sample_idx++, window_idx += window_stride) {
            peak = std::max<float>(peak, std::abs((windowed_frame[sample_idx] + clipping_delta[sample_idx]) * inv_window[window_idx]));
        }
        peak /= this->clip_level;

        // Automatically adjust mask_curve as necessary to reach peak target
        float mask_curve_shift = 1.122; // 1.122 is 1dB
        if (orig_peak > 1.0 && peak > 1.0) {
            float diff_achieved = orig_peak - peak;
            if (i + 1 < this->iterations - this->iterations / 3 && diff_achieved > 0) {
                float diff_needed = orig_peak - 1.0;
                float diff_ratio = diff_needed / diff_achieved;
                // If a good amount of peak reduction was already achieved,
                // don't shift the mask_curve by the full peak value
                // On the other hand, if only a little peak reduction was achieved,
                // don't shift the mask_curve by the enormous diff_ratio.
                diff_ratio = std::min<float>(diff_ratio, peak);
                mask_curve_shift = std::max<float>(mask_curve_shift, diff_ratio);
            } else {
                // If the peak got higher than the input or we are in the last 1/3 rounds,
                // go back to the heavy-handed peak heuristic.
                mask_curve_shift = std::max<float>(mask_curve_shift, peak);
            }
        }

        mask_curve_shift = 1.0 + (mask_curve_shift - 1.0) * this->adaptive_distortion_strength;

        if (total_margin_shift && peak > 1.01 && i < this->iterations - 1) {
            *total_margin_shift *= mask_curve_shift;
        }

        // Be less strict in the next iteration.
        // This helps with peak control.
        for (int i = 0; i < this->size / 2 + 1; i++) {
            mask_curve[i] *= mask_curve_shift;
        }
    }

    if (this->oversample > 1) {
        // Downsample back to original rate.
        // We already zeroed out all frequency bins above the base nyquist rate so we can simply drop samples here.
        for (int i = 0; i < this->size; i++) {
            clipping_delta[i] = clipping_delta[i * this->oversample];
        }
    }

    // do overlap & add
    apply_window(clipping_delta, this->out_dist_frame.data(), true);

    for (int i = 0; i < this->overlap; i++) {
        // 4 times overlap with squared hanning window results in 1.5 time increase in amplitude
        out_samples[i] = this->out_dist_frame[i] / 1.5;
    }

    if (this->oversample > 1) {
        // When oversampling is active, the clipping delta can be non-zero even if all the samples in the frame are well below the threshold.
        // This is likely due to the aliasing introduced when windowing near-nyquist frequencies.
        // For purity, detect and remove these unwanted changes to the input signal.
        // The effect on peak control is < 0.1% or -60dB. Oversampling is not exact anyway.
        float max_out_diff = 0;
        for (int i = 0; i < this->overlap; i++) {
            max_out_diff = std::max(max_out_diff, std::abs(out_samples[i]));
        }
        if (max_out_diff < this->clip_level * 0.001) {
            for (int i = 0; i < this->overlap; i++) {
                out_samples[i] = 0;
            }
        }
    }

    if (!diff_only) {
        for (int i = 0; i < this->overlap; i++) {
            out_samples[i] += this->in_frame[i];
        }
    }
}